

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
          (TransformFeedbackOverflowQueryBaseTest *this)

{
  bool bVar1;
  ContextType ctxType;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_transform_feedback3")
  ;
  if (bVar1) {
    return true;
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  return bVar1;
}

Assistant:

bool supportsTransformFeedback3()
	{
		return (m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3") ||
				glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(4, 0, glu::PROFILE_CORE)));
	}